

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O1

void ProcessPendingTelemetryMessages(PMQTTTRANSPORT_HANDLE_DATA transport_data)

{
  DLIST_ENTRY_TAG **mqttMsgEntry;
  DLIST_ENTRY_TAG *pDVar1;
  DLIST_ENTRY_TAG *pDVar2;
  _Bool _Var3;
  int iVar4;
  LOGGER_LOG p_Var5;
  DLIST_ENTRY_TAG *pDVar6;
  uchar *messagePayload;
  tickcounter_ms_t current_ms;
  DLIST_ENTRY_TAG *local_50;
  size_t messageLength;
  DLIST_ENTRY messageCompleted;
  
  pDVar6 = (transport_data->telemetry_waitingForAck).Flink;
  tickcounter_get_current_ms(transport_data->msgTickCounter,&current_ms);
  local_50 = &transport_data->telemetry_waitingForAck;
  if (pDVar6 != &transport_data->telemetry_waitingForAck) {
    do {
      mqttMsgEntry = &pDVar6[-3].Blink;
      pDVar1 = pDVar6->Flink;
      if (current_ms - (long)pDVar6[-3].Blink < 120000) {
        if (60999 < current_ms - (long)pDVar6[-2].Flink) {
          if (transport_data->currPacketState == PUBLISH_TYPE) {
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 != (LOGGER_LOG)0x0) {
              (*p_Var5)(AZ_LOG_INFO,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                        ,"ProcessPendingTelemetryMessages",0x9d2,1,
                        "Publish MQTT packet timeout. current_ms:%lu, msgPublishTime:%lu, msgCreationTime:%lu, packet_id:%d"
                        ,current_ms,pDVar6[-2].Flink,*mqttMsgEntry,
                        (ulong)*(ushort *)&pDVar6[-1].Blink);
            }
            messagePayload = (uchar *)0x0;
            _Var3 = RetrieveMessagePayload
                              ((IOTHUB_MESSAGE_HANDLE)(pDVar6[-2].Blink)->Flink,&messagePayload,
                               &messageLength);
            if (_Var3) {
              iVar4 = publishTelemetryMsg(transport_data,(MQTT_MESSAGE_DETAILS_LIST *)mqttMsgEntry,
                                          messagePayload,messageLength,true);
              if (iVar4 != 0) {
                DList_RemoveEntryList(pDVar6);
                pDVar6 = pDVar6[-2].Blink;
                DList_InitializeListHead(&messageCompleted);
                DList_InsertTailList(&messageCompleted,(PDLIST_ENTRY)&pDVar6[1].Blink);
                (*(transport_data->transport_callbacks).send_complete_cb)
                          (&messageCompleted,IOTHUB_CLIENT_CONFIRMATION_ERROR,
                           transport_data->transport_ctx);
                free(mqttMsgEntry);
              }
            }
            else {
              DList_RemoveEntryList(pDVar6);
              pDVar6 = pDVar6[-2].Blink;
              DList_InitializeListHead(&messageCompleted);
              DList_InsertTailList(&messageCompleted,(PDLIST_ENTRY)&pDVar6[1].Blink);
              (*(transport_data->transport_callbacks).send_complete_cb)
                        (&messageCompleted,IOTHUB_CLIENT_CONFIRMATION_ERROR,
                         transport_data->transport_ctx);
            }
          }
          else {
            pDVar6[-2].Flink = (DLIST_ENTRY_TAG *)current_ms;
          }
        }
      }
      else {
        pDVar2 = pDVar6[-2].Blink;
        DList_InitializeListHead(&messageCompleted);
        DList_InsertTailList(&messageCompleted,(PDLIST_ENTRY)&pDVar2[1].Blink);
        (*(transport_data->transport_callbacks).send_complete_cb)
                  (&messageCompleted,IOTHUB_CLIENT_CONFIRMATION_MESSAGE_TIMEOUT,
                   transport_data->transport_ctx);
        DList_RemoveEntryList(pDVar6);
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 != (LOGGER_LOG)0x0) {
          (*p_Var5)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                    ,"ProcessPendingTelemetryMessages",0x9c6,1,
                    "Disconnecting MQTT connection because message PUBACK (%d) timeout.",
                    (ulong)*(ushort *)&pDVar6[-1].Blink);
        }
        free(mqttMsgEntry);
        DisconnectFromClient(transport_data);
        (*(transport_data->transport_callbacks).connection_status_cb)
                  (IOTHUB_CLIENT_CONNECTION_UNAUTHENTICATED,
                   IOTHUB_CLIENT_CONNECTION_COMMUNICATION_ERROR,transport_data->transport_ctx);
      }
      pDVar6 = pDVar1;
    } while (pDVar1 != local_50);
  }
  return;
}

Assistant:

static void ProcessPendingTelemetryMessages(PMQTTTRANSPORT_HANDLE_DATA transport_data)
{
    PDLIST_ENTRY current_entry = transport_data->telemetry_waitingForAck.Flink;
    tickcounter_ms_t current_ms;
    (void)tickcounter_get_current_ms(transport_data->msgTickCounter, &current_ms);
    while (current_entry != &transport_data->telemetry_waitingForAck)
    {
        MQTT_MESSAGE_DETAILS_LIST* msg_detail_entry = containingRecord(current_entry, MQTT_MESSAGE_DETAILS_LIST, entry);
        DLIST_ENTRY nextListEntry;
        nextListEntry.Flink = current_entry->Flink;

        if (((current_ms - msg_detail_entry->msgCreationTime) / 1000) >= TELEMETRY_MSG_TIMEOUT_MIN)
        {
            notifyApplicationOfSendMessageComplete(msg_detail_entry->iotHubMessageEntry, transport_data, IOTHUB_CLIENT_CONFIRMATION_MESSAGE_TIMEOUT);
            (void)DList_RemoveEntryList(current_entry);
            LogError("Disconnecting MQTT connection because message PUBACK (%d) timeout.", msg_detail_entry->packet_id);
            free(msg_detail_entry);

            DisconnectFromClient(transport_data);
            transport_data->transport_callbacks.connection_status_cb(IOTHUB_CLIENT_CONNECTION_UNAUTHENTICATED, IOTHUB_CLIENT_CONNECTION_COMMUNICATION_ERROR, transport_data->transport_ctx);
        }
        else if (((current_ms - msg_detail_entry->msgPublishTime) / 1000) > RESEND_TIMEOUT_VALUE_MIN)
        {
            // Ensure that the packet state is PUBLISH_TYPE and then attempt to send the message
            // again
            if (transport_data->currPacketState == PUBLISH_TYPE)
            {
                LogInfo("Publish MQTT packet timeout. current_ms:%" PRIu64 ", msgPublishTime:%" PRIu64 ", msgCreationTime:%" PRIu64 ", packet_id:%d", (uint64_t)current_ms, (uint64_t)msg_detail_entry->msgPublishTime, (uint64_t)msg_detail_entry->msgCreationTime, msg_detail_entry->packet_id);
                size_t messageLength;
                const unsigned char* messagePayload = NULL;
                if (!RetrieveMessagePayload(msg_detail_entry->iotHubMessageEntry->messageHandle, &messagePayload, &messageLength))
                {
                    (void)DList_RemoveEntryList(current_entry);
                    notifyApplicationOfSendMessageComplete(msg_detail_entry->iotHubMessageEntry, transport_data, IOTHUB_CLIENT_CONFIRMATION_ERROR);
                }
                else
                {
                    if (publishTelemetryMsg(transport_data, msg_detail_entry, messagePayload, messageLength, MQTT_MESSAGE_DUP_FLAG_TRUE) != 0)
                    {
                        (void)DList_RemoveEntryList(current_entry);
                        notifyApplicationOfSendMessageComplete(msg_detail_entry->iotHubMessageEntry, transport_data, IOTHUB_CLIENT_CONFIRMATION_ERROR);
                        free(msg_detail_entry);
                    }
                }
            }
            else
            {
                msg_detail_entry->msgPublishTime = current_ms;
            }
        }
        current_entry = nextListEntry.Flink;
    }
}